

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

void __thiscall LruHash<IPAsKeyLRU>::LruUnlink(LruHash<IPAsKeyLRU> *this,IPAsKeyLRU *key)

{
  IPAsKeyLRU *pIVar1;
  IPAsKeyLRU *pIVar2;
  LruHash<IPAsKeyLRU> *pLVar3;
  IPAsKeyLRU **ppIVar4;
  
  if (key != (IPAsKeyLRU *)0x0) {
    pIVar1 = key->MoreRecentKey;
    pIVar2 = key->LessRecentKey;
    pLVar3 = (LruHash<IPAsKeyLRU> *)&pIVar1->LessRecentKey;
    if (pIVar1 == (IPAsKeyLRU *)0x0) {
      pLVar3 = this;
    }
    ppIVar4 = &pIVar2->MoreRecentKey;
    if (pIVar2 == (IPAsKeyLRU *)0x0) {
      ppIVar4 = &this->LeastRecentlyUsed;
    }
    pLVar3->MostRecentlyUsed = pIVar2;
    *ppIVar4 = pIVar1;
    key->MoreRecentKey = (IPAsKeyLRU *)0x0;
    key->LessRecentKey = (IPAsKeyLRU *)0x0;
  }
  return;
}

Assistant:

void LruUnlink(KeyObj * key)
    {
        if (key != NULL)
        {
            /* If the object was newly created, the more and less recent keys should be NULL */

            if (key->MoreRecentKey != NULL)
            {
                key->MoreRecentKey->LessRecentKey = key->LessRecentKey;
            }
            else
            {
                MostRecentlyUsed = key->LessRecentKey;
            }

            if (key->LessRecentKey != NULL)
            {
                key->LessRecentKey->MoreRecentKey = key->MoreRecentKey;
            }
            else
            {
                LeastRecentlyUsed = key->MoreRecentKey;
            }

            key->MoreRecentKey = NULL;
            key->LessRecentKey = NULL;
        }
    }